

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

int cs_impl::try_convert_and_check<int,_cs::numeric,_int,_0UL>::convert(var *val)

{
  bool bVar1;
  type_info *ptVar2;
  numeric *pnVar3;
  runtime_error *this;
  char *name;
  char *name_00;
  int local_188;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ptVar2 = any::type(val);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::numeric::typeinfo);
  if (bVar1) {
    pnVar3 = any::const_val<cs::numeric>(val);
    if (pnVar3->type == false) {
      local_188 = (int)(long)ROUND(*(longdouble *)&pnVar3->data);
      return local_188;
    }
  }
  else {
    ptVar2 = any::type(val);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&int::typeinfo);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_120,1);
      std::operator+(&local_100,"Invalid Argument. At ",&local_120);
      std::operator+(&local_e0,&local_100,". Expected ");
      cxx_demangle_abi_cxx11_(&local_140,(cs_impl *)(_put + (*_put == '*')),name);
      std::operator+(&local_c0,&local_e0,&local_140);
      std::operator+(&local_a0,&local_c0,", compatible with ");
      cxx_demangle_abi_cxx11_(&local_160,(cs_impl *)"cs::numeric",name_00);
      std::operator+(&local_80,&local_a0,&local_160);
      std::operator+(&local_60,&local_80,", provided ");
      any::get_type_name_abi_cxx11_(&local_180,val);
      std::operator+(&local_40,&local_60,&local_180);
      cs::runtime_error::runtime_error(this,&local_40);
      __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    pnVar3 = (numeric *)any::const_val<int>(val);
  }
  return *(int *)&pnVar3->data;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_SourceT))
				return type_convertor<_SourceT, _TargetT>::convert(convert_helper<_SourceT>::get_val(val));
			else if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", compatible with " +
				                        cxx_demangle(get_name_of_type<_SourceT>()) + ", provided " +
				                        val.get_type_name());
		}